

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_mask_strong_bcs(REF_GRID ref_grid,REF_DICT ref_dict,REF_BOOL *replace,REF_INT ldim)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  REF_CELL ref_cell;
  REF_BOOL *pRVar4;
  REF_STATUS RVar5;
  uint uVar6;
  REF_CELL *ppRVar7;
  uint uVar8;
  int cell;
  long lVar9;
  ulong uVar10;
  long lVar11;
  REF_INT bc;
  REF_INT nodes [27];
  REF_INT local_cc;
  size_t local_c8;
  REF_BOOL *local_c0;
  REF_GRID local_b8;
  REF_DICT local_b0;
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->node;
  uVar8 = 6;
  if (ldim % 6 != 0) {
    uVar8 = (uint)(ldim * -0x33333333 + 0x19999999U < 0x33333333) * 5;
  }
  local_c0 = replace;
  local_b8 = ref_grid;
  local_b0 = ref_dict;
  if (0 < pRVar2->max) {
    pRVar3 = pRVar2->global;
    local_c8 = (ulong)(uint)ldim << 2;
    uVar10 = 0;
    lVar11 = 0;
    do {
      if (-1 < pRVar3[lVar11] && 0 < ldim) {
        memset(local_c0 + uVar10,0,local_c8);
      }
      lVar11 = lVar11 + 1;
      uVar10 = (ulong)(uint)((int)uVar10 + ldim);
    } while (lVar11 < pRVar2->max);
  }
  pRVar4 = local_c0;
  ppRVar7 = local_b8->cell;
  if (local_b8->twod == 0) {
    ppRVar7 = local_b8->cell + 3;
  }
  ref_cell = *ppRVar7;
  if (0 < ref_cell->max) {
    cell = 0;
    do {
      RVar5 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar5 == 0) {
        local_cc = -1;
        uVar6 = ref_dict_value(local_b0,local_a8[ref_cell->node_per],&local_cc);
        if ((uVar6 != 0) && (uVar6 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x17d,"ref_phys_mask_strong_bcs",(ulong)uVar6,"bc");
          local_c8 = CONCAT44(local_c8._4_4_,uVar6);
        }
        if ((uVar6 != 5) && (uVar6 != 0)) {
          return (REF_STATUS)local_c8;
        }
        if (0 < ref_cell->node_per) {
          lVar11 = 0;
          do {
            if (local_cc == 4000) {
              iVar1 = local_a8[lVar11];
              lVar9 = 0;
              do {
                pRVar4[(ulong)uVar8 + (long)(iVar1 * ldim) + lVar9 + 1] = 1;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 4);
              if (ldim % 6 == 0) {
                local_c0[(int)(iVar1 * ldim + uVar8 + 5)] = 1;
              }
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < ref_cell->node_per);
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_mask_strong_bcs(REF_GRID ref_grid,
                                            REF_DICT ref_dict,
                                            REF_BOOL *replace, REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
  REF_INT first, last, i, node, bc;
  REF_INT nequ;

  nequ = 0;
  if (0 == ldim % 5) nequ = 5;
  if (0 == ldim % 6) nequ = 6;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < ldim; i++) {
      replace[i + ldim * node] = REF_FALSE;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      node = nodes[cell_node];
      if (4000 == bc) {
        first = nequ + 1; /* first momentum */
        last = nequ + 4;  /* energy */
        for (i = first; i <= last; i++) replace[i + ldim * node] = REF_TRUE;
        if (6 == nequ) replace[nequ + 5 + ldim * node] = REF_TRUE; /* turb */
      }
    }
  }

  return REF_SUCCESS;
}